

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

Vec_Mem_t * Vec_MemAlloc(int nEntrySize,int LogPageSze)

{
  Vec_Mem_t *pVVar1;
  Vec_Mem_t *p;
  int LogPageSze_local;
  int nEntrySize_local;
  
  pVVar1 = (Vec_Mem_t *)calloc(1,0x30);
  pVVar1->nEntrySize = nEntrySize;
  pVVar1->LogPageSze = LogPageSze;
  pVVar1->PageMask = (1 << ((byte)pVVar1->LogPageSze & 0x1f)) + -1;
  pVVar1->iPage = -1;
  return pVVar1;
}

Assistant:

static inline Vec_Mem_t * Vec_MemAlloc( int nEntrySize, int LogPageSze )
{
    Vec_Mem_t * p;
    p = ABC_CALLOC( Vec_Mem_t, 1 );
    p->nEntrySize = nEntrySize;
    p->LogPageSze = LogPageSze;
    p->PageMask   = (1 << p->LogPageSze) - 1;
    p->iPage      = -1;
    return p;
}